

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, int>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, int>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<int, int>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, int>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }